

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_quantize_sse2.c
# Opt level: O3

void aom_quantize_b_32x32_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  tran_low_t *ptVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  bool bVar18;
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  bool bVar27;
  undefined1 auVar28 [14];
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  undefined1 auVar42 [14];
  undefined1 auVar43 [14];
  undefined1 auVar44 [14];
  unkbyte10 Var45;
  undefined1 auVar46 [12];
  undefined1 auVar47 [14];
  undefined1 auVar48 [12];
  undefined1 auVar49 [14];
  undefined1 auVar50 [14];
  undefined1 auVar51 [14];
  undefined1 auVar52 [12];
  undefined1 auVar53 [14];
  undefined1 auVar54 [12];
  unkbyte10 Var55;
  bool bVar56;
  bool bVar57;
  ulong uVar58;
  uint uVar59;
  short *psVar60;
  long lVar61;
  long lVar62;
  int *piVar63;
  int *piVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  uint uVar72;
  short sVar93;
  int iVar94;
  short sVar96;
  undefined1 auVar74 [12];
  undefined4 uVar97;
  short sVar100;
  undefined4 uVar101;
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  int iVar73;
  int iVar98;
  int iVar102;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  short sVar92;
  short sVar95;
  short sVar99;
  short sVar103;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  short sVar118;
  ushort uVar121;
  undefined1 auVar119 [16];
  short sVar122;
  undefined1 auVar120 [16];
  ushort uVar123;
  ushort uVar128;
  ushort uVar129;
  ushort uVar130;
  ushort uVar131;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  ushort uVar132;
  short sVar141;
  ushort uVar143;
  undefined1 auVar133 [12];
  ushort uVar138;
  ushort uVar139;
  ushort uVar140;
  ushort uVar142;
  ushort uVar144;
  undefined1 auVar134 [16];
  ushort uVar145;
  short sVar146;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  short sVar151;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  int iVar152;
  undefined1 auVar153 [12];
  int iVar161;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  int iVar162;
  int iVar163;
  undefined1 auVar158 [16];
  undefined1 auVar160 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  ushort uVar173;
  ushort uVar174;
  ushort uVar181;
  ushort uVar182;
  ushort uVar183;
  ushort uVar184;
  ushort uVar185;
  ushort uVar186;
  ushort uVar187;
  ushort uVar188;
  undefined1 auVar176 [12];
  undefined1 auVar180 [16];
  ushort uVar189;
  ushort uVar190;
  ushort uVar195;
  ushort uVar196;
  ushort uVar197;
  ushort uVar198;
  ushort uVar199;
  ushort uVar200;
  ushort uVar201;
  ushort uVar202;
  undefined1 auVar194 [16];
  short sVar209;
  short sVar210;
  short sVar211;
  short sVar212;
  short sVar213;
  short sVar214;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  short sVar215;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  int local_88;
  int aiStack_84 [5];
  undefined8 local_70;
  undefined1 local_68 [16];
  int thresh [4];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar75 [12];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar76 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar135 [16];
  undefined1 auVar159 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined8 uVar175;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined8 uVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  
  auVar66 = psraw(ZEXT416(*(uint *)zbin_ptr),1);
  auVar65 = ZEXT416(*(uint *)zbin_ptr) & _DAT_00d12b10;
  auVar119._0_2_ = auVar65._0_2_ + auVar66._0_2_;
  auVar119._2_2_ = auVar65._2_2_ + auVar66._2_2_;
  auVar119._4_2_ = auVar66._4_2_;
  auVar119._6_2_ = auVar66._6_2_;
  auVar119._8_2_ = auVar65._8_2_ + auVar66._8_2_;
  auVar119._10_2_ = auVar65._10_2_ + auVar66._10_2_;
  auVar119._12_2_ = auVar65._12_2_ + auVar66._12_2_;
  auVar119._14_2_ = auVar65._14_2_ + auVar66._14_2_;
  auVar65 = pshuflw(auVar119,auVar119,0x60);
  local_70 = CONCAT44(auVar65._4_4_ >> 0x10,auVar65._0_4_ >> 0x10);
  lVar61 = 0;
  piVar63 = &local_88;
  piVar64 = (int *)&local_70;
  bVar56 = true;
  do {
    bVar57 = bVar56;
    *piVar63 = (dequant_ptr[lVar61] * 0x145 + 0x40 >> 7) + *piVar64 * 0x20 + -1;
    lVar61 = 1;
    piVar63 = aiStack_84;
    piVar64 = (int *)((long)&local_70 + 4);
    bVar56 = false;
  } while (bVar57);
  auVar66._8_4_ = 0xffffffff;
  auVar66._0_8_ = 0xffffffffffffffff;
  auVar66._12_4_ = 0xffffffff;
  uVar128 = (ushort)(zbin_ptr[4] + 1U) >> 1;
  uVar129 = (ushort)(zbin_ptr[5] + 1U) >> 1;
  uVar130 = (ushort)(zbin_ptr[6] + 1U) >> 1;
  uVar131 = (ushort)(zbin_ptr[7] + 1U) >> 1;
  sVar67 = uVar128 - 1;
  sVar68 = uVar129 - 1;
  sVar69 = uVar130 - 1;
  sVar70 = uVar131 - 1;
  auVar164 = packssdw(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  auVar154 = packssdw(*(undefined1 (*) [16])(coeff_ptr + 8),*(undefined1 (*) [16])(coeff_ptr + 0xc))
  ;
  sVar71 = auVar164._0_2_;
  sVar141 = -sVar71;
  sVar92 = auVar164._2_2_;
  sVar118 = -sVar92;
  sVar93 = auVar164._4_2_;
  sVar122 = -sVar93;
  sVar95 = auVar164._6_2_;
  sVar146 = -sVar95;
  sVar96 = auVar164._8_2_;
  sVar151 = -sVar96;
  sVar99 = auVar164._10_2_;
  sVar2 = -sVar99;
  sVar100 = auVar164._12_2_;
  sVar3 = -sVar100;
  sVar103 = auVar164._14_2_;
  sVar4 = -sVar103;
  uVar173 = (ushort)(sVar141 < sVar71) * sVar71 | (ushort)(sVar141 >= sVar71) * sVar141;
  uVar181 = (ushort)(sVar118 < sVar92) * sVar92 | (ushort)(sVar118 >= sVar92) * sVar118;
  uVar183 = (ushort)(sVar122 < sVar93) * sVar93 | (ushort)(sVar122 >= sVar93) * sVar122;
  uVar185 = (ushort)(sVar146 < sVar95) * sVar95 | (ushort)(sVar146 >= sVar95) * sVar146;
  uVar175 = CONCAT26(uVar185,CONCAT24(uVar183,CONCAT22(uVar181,uVar173)));
  uVar187 = (ushort)(sVar151 < sVar96) * sVar96 | (ushort)(sVar151 >= sVar96) * sVar151;
  auVar177._0_10_ = CONCAT28(uVar187,uVar175);
  auVar177._10_2_ = (ushort)(sVar2 < sVar99) * sVar99 | (ushort)(sVar2 >= sVar99) * sVar2;
  auVar177._12_2_ = (ushort)(sVar3 < sVar100) * sVar100 | (ushort)(sVar3 >= sVar100) * sVar3;
  auVar177._14_2_ = (ushort)(sVar4 < sVar103) * sVar103 | (ushort)(sVar4 >= sVar103) * sVar4;
  sVar71 = auVar154._0_2_;
  sVar141 = -sVar71;
  sVar92 = auVar154._2_2_;
  sVar118 = -sVar92;
  sVar93 = auVar154._4_2_;
  sVar122 = -sVar93;
  sVar95 = auVar154._6_2_;
  sVar146 = -sVar95;
  sVar96 = auVar154._8_2_;
  sVar151 = -sVar96;
  sVar99 = auVar154._10_2_;
  sVar2 = -sVar99;
  sVar100 = auVar154._12_2_;
  sVar3 = -sVar100;
  sVar103 = auVar154._14_2_;
  sVar4 = -sVar103;
  uVar189 = (ushort)(sVar141 < sVar71) * sVar71 | (ushort)(sVar141 >= sVar71) * sVar141;
  uVar195 = (ushort)(sVar118 < sVar92) * sVar92 | (ushort)(sVar118 >= sVar92) * sVar118;
  uVar197 = (ushort)(sVar122 < sVar93) * sVar93 | (ushort)(sVar122 >= sVar93) * sVar122;
  uVar199 = (ushort)(sVar146 < sVar95) * sVar95 | (ushort)(sVar146 >= sVar95) * sVar146;
  uVar191 = CONCAT26(uVar199,CONCAT24(uVar197,CONCAT22(uVar195,uVar189)));
  uVar201 = (ushort)(sVar151 < sVar96) * sVar96 | (ushort)(sVar151 >= sVar96) * sVar151;
  auVar192._0_10_ = CONCAT28(uVar201,uVar191);
  auVar192._10_2_ = (ushort)(sVar2 < sVar99) * sVar99 | (ushort)(sVar2 >= sVar99) * sVar2;
  auVar192._12_2_ = (ushort)(sVar3 < sVar100) * sVar100 | (ushort)(sVar3 >= sVar100) * sVar3;
  auVar192._14_2_ = (ushort)(sVar4 < sVar103) * sVar103 | (ushort)(sVar4 >= sVar103) * sVar4;
  auVar5._10_2_ = 0;
  auVar5._0_10_ = auVar177._0_10_;
  auVar5._12_2_ = uVar185;
  auVar10._8_2_ = uVar183;
  auVar10._0_8_ = uVar175;
  auVar10._10_4_ = auVar5._10_4_;
  auVar42._6_8_ = 0;
  auVar42._0_6_ = auVar10._8_6_;
  auVar22._4_2_ = uVar181;
  auVar22._0_4_ = CONCAT22(uVar181,uVar173);
  auVar22._6_8_ = SUB148(auVar42 << 0x40,6);
  auVar6._10_2_ = 0;
  auVar6._0_10_ = auVar192._0_10_;
  auVar6._12_2_ = uVar199;
  auVar11._8_2_ = uVar197;
  auVar11._0_8_ = uVar191;
  auVar11._10_4_ = auVar6._10_4_;
  auVar43._6_8_ = 0;
  auVar43._0_6_ = auVar11._8_6_;
  auVar23._4_2_ = uVar195;
  auVar23._0_4_ = CONCAT22(uVar195,uVar189);
  auVar23._6_8_ = SUB148(auVar43 << 0x40,6);
  auVar106._0_4_ = -(uint)(local_88 < (int)((uint)uVar173 << 5));
  auVar106._4_4_ = -(uint)(aiStack_84[0] < auVar22._4_4_ << 5);
  auVar106._8_4_ = -(uint)(aiStack_84[0] < auVar10._8_4_ << 5);
  auVar106._12_4_ = -(uint)(aiStack_84[0] < (int)((auVar5._10_4_ >> 0x10) << 5));
  auVar65._0_4_ = -(uint)(aiStack_84[0] < (int)((uint)uVar187 << 5));
  auVar65._4_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar177._10_2_ << 5));
  auVar65._8_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar177._12_2_ << 5));
  auVar65._12_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar177._14_2_ << 5));
  auVar119 = packssdw(auVar106,auVar65);
  auVar155._0_4_ = -(uint)(aiStack_84[0] < (int)((uint)uVar189 << 5));
  auVar155._4_4_ = -(uint)(aiStack_84[0] < auVar23._4_4_ << 5);
  auVar155._8_4_ = -(uint)(aiStack_84[0] < auVar11._8_4_ << 5);
  auVar155._12_4_ = -(uint)(aiStack_84[0] < (int)((auVar6._10_4_ >> 0x10) << 5));
  auVar134._0_4_ = -(uint)(aiStack_84[0] < (int)((uint)uVar201 << 5));
  auVar134._4_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar192._10_2_ << 5));
  auVar134._8_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar192._12_2_ << 5));
  auVar134._12_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar192._14_2_ << 5));
  auVar134 = packssdw(auVar155,auVar134);
  auVar65 = auVar134 | auVar119;
  uVar132 = 0;
  uVar138 = 0;
  uVar139 = 0;
  uVar140 = 0;
  uVar142 = 0;
  uVar143 = 0;
  uVar144 = 0;
  uVar145 = 0;
  bVar39 = (auVar65 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar40 = (auVar65 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar38 = (auVar65 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar37 = (auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar36 = (auVar65 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar35 = (auVar65 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar34 = (auVar65 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar33 = (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar32 = (auVar65 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar31 = (auVar65 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar30 = (auVar65 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar29 = (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar27 = (auVar65 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar18 = (auVar65 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar57 = (auVar65 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar56 = auVar65[0xf] < '\0';
  if (((((((((((((((bVar39 || bVar40) || bVar38) || bVar37) || bVar36) || bVar35) || bVar34) ||
             bVar33) || bVar32) || bVar31) || bVar30) || bVar29) || bVar27) || bVar18) || bVar57) ||
      bVar56) {
    auVar119 = auVar119 & *(undefined1 (*) [16])iscan;
    auVar134 = auVar134 & *(undefined1 (*) [16])(iscan + 8);
    sVar141 = auVar119._0_2_;
    sVar118 = auVar134._0_2_;
    uVar132 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
    sVar141 = auVar119._2_2_;
    sVar118 = auVar134._2_2_;
    uVar138 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
    sVar141 = auVar119._4_2_;
    sVar118 = auVar134._4_2_;
    uVar139 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
    sVar141 = auVar119._6_2_;
    sVar118 = auVar134._6_2_;
    uVar140 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
    sVar141 = auVar119._8_2_;
    sVar118 = auVar134._8_2_;
    uVar142 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
    sVar141 = auVar119._10_2_;
    sVar118 = auVar134._10_2_;
    uVar143 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
    sVar141 = auVar119._12_2_;
    sVar118 = auVar134._12_2_;
    sVar122 = auVar134._14_2_;
    uVar144 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
    sVar141 = auVar119._14_2_;
    uVar145 = (ushort)(sVar122 < sVar141) * sVar141 | (ushort)(sVar122 >= sVar141) * sVar122;
  }
  bVar56 = ((((((((((((((bVar39 || bVar40) || bVar38) || bVar37) || bVar36) || bVar35) || bVar34) ||
                  bVar33) || bVar32) || bVar31) || bVar30) || bVar29) || bVar27) || bVar18) ||
           bVar57) || bVar56;
  auVar65 = *(undefined1 (*) [16])quant_ptr;
  auVar119 = *(undefined1 (*) [16])dequant_ptr;
  auVar134 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar74._0_2_ = (ushort)(*round_ptr + 1U) >> 1;
  auVar74._2_2_ = (ushort)(round_ptr[1] + 1U) >> 1;
  auVar74._4_2_ = (ushort)(round_ptr[2] + 1U) >> 1;
  auVar74._6_2_ = (ushort)(round_ptr[3] + 1U) >> 1;
  auVar74._8_2_ = (ushort)(round_ptr[4] + 1U) >> 1;
  auVar74._10_2_ = (ushort)(round_ptr[5] + 1U) >> 1;
  auVar76._12_2_ = (ushort)(round_ptr[6] + 1U) >> 1;
  auVar76._0_12_ = auVar74;
  auVar76._14_2_ = (ushort)(round_ptr[7] + 1U) >> 1;
  auVar124._0_2_ = -(ushort)((short)uVar173 < (short)((ushort)(*zbin_ptr + 1U) >> 1));
  auVar124._2_2_ = -(ushort)((short)uVar181 < (short)((ushort)(zbin_ptr[1] + 1U) >> 1));
  auVar124._4_2_ = -(ushort)((short)uVar183 < (short)((ushort)(zbin_ptr[2] + 1U) >> 1));
  auVar124._6_2_ = -(ushort)((short)uVar185 < (short)((ushort)(zbin_ptr[3] + 1U) >> 1));
  auVar124._8_2_ = -(ushort)((short)uVar187 < (short)uVar128);
  auVar124._10_2_ = -(ushort)((short)auVar177._10_2_ < (short)uVar129);
  auVar124._12_2_ = -(ushort)((short)auVar177._12_2_ < (short)uVar130);
  auVar124._14_2_ = -(ushort)((short)auVar177._14_2_ < (short)uVar131);
  auVar216._0_2_ = -(ushort)(sVar67 < (short)uVar189);
  auVar216._2_2_ = -(ushort)(sVar68 < (short)uVar195);
  auVar216._4_2_ = -(ushort)(sVar69 < (short)uVar197);
  auVar216._6_2_ = -(ushort)(sVar70 < (short)uVar199);
  auVar216._8_2_ = -(ushort)(sVar67 < (short)uVar201);
  auVar216._10_2_ = -(ushort)(sVar68 < (short)auVar192._10_2_);
  auVar216._12_2_ = -(ushort)(sVar69 < (short)auVar192._12_2_);
  auVar216._14_2_ = -(ushort)(sVar70 < (short)auVar192._14_2_);
  auVar106 = auVar216 | auVar66 ^ auVar124;
  bVar40 = (auVar106 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar41 = (auVar106 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar39 = (auVar106 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar38 = (auVar106 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar37 = (auVar106 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar36 = (auVar106 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar35 = (auVar106 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar34 = (auVar106 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar33 = (auVar106 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar32 = (auVar106 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar31 = (auVar106 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar30 = (auVar106 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar29 = (auVar106 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar27 = (auVar106 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar18 = (auVar106 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar57 = -1 < auVar106[0xf];
  uVar97 = auVar74._8_4_;
  uVar101 = auVar76._12_4_;
  local_68._0_8_ = auVar65._8_8_;
  auVar105._0_8_ = auVar134._8_8_;
  auVar127._0_8_ = auVar119._8_8_;
  if (((((((((((((((bVar40 && bVar41) && bVar39) && bVar38) && bVar37) && bVar36) && bVar35) &&
             bVar34) && bVar33) && bVar32) && bVar31) && bVar30) && bVar29) && bVar27) && bVar18) &&
      bVar57) {
    iVar152 = 0;
    iVar161 = 0;
    iVar162 = 0;
    iVar163 = 0;
    *(undefined1 (*) [16])(qcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    auVar154._4_4_ = uVar101;
    auVar154._0_4_ = uVar97;
    auVar154._8_4_ = uVar97;
    auVar154._12_4_ = uVar101;
    local_68._8_4_ = auVar65._8_4_;
    local_68._12_4_ = auVar65._12_4_;
    auVar105._8_4_ = auVar134._8_4_;
    auVar105._12_4_ = auVar134._12_4_;
    auVar127._8_4_ = auVar119._8_4_;
    auVar127._12_4_ = auVar119._12_4_;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = (undefined1  [16])0x0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    iVar73 = 0;
    iVar94 = 0;
    iVar98 = 0;
    iVar102 = 0;
    uVar129 = 0;
    uVar128 = 0;
    uVar185 = 0;
    uVar183 = 0;
    uVar181 = 0;
    uVar173 = 0;
    uVar131 = 0;
    uVar130 = 0;
  }
  else {
    auVar165 = psraw(auVar164,0xf);
    auVar155 = psraw(auVar154,0xf);
    auVar66 = (auVar66 ^ auVar124) & *(undefined1 (*) [16])iscan;
    auVar106 = *(undefined1 (*) [16])(iscan + 8) & auVar216;
    sVar141 = auVar66._0_2_;
    sVar118 = auVar106._0_2_;
    uVar129 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
    sVar141 = auVar66._2_2_;
    sVar118 = auVar106._2_2_;
    uVar128 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
    sVar141 = auVar66._4_2_;
    sVar118 = auVar106._4_2_;
    uVar185 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
    sVar141 = auVar66._6_2_;
    sVar118 = auVar106._6_2_;
    uVar183 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
    sVar141 = auVar66._8_2_;
    sVar118 = auVar106._8_2_;
    uVar181 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
    sVar141 = auVar66._10_2_;
    sVar118 = auVar106._10_2_;
    uVar173 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
    sVar141 = auVar66._12_2_;
    sVar118 = auVar106._12_2_;
    sVar122 = auVar106._14_2_;
    uVar131 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
    sVar141 = auVar66._14_2_;
    uVar130 = (ushort)(sVar122 < sVar141) * sVar141 | (ushort)(sVar122 >= sVar141) * sVar122;
    uVar129 = (-1 < (short)uVar129) * uVar129;
    uVar128 = (-1 < (short)uVar128) * uVar128;
    uVar185 = (-1 < (short)uVar185) * uVar185;
    uVar183 = (-1 < (short)uVar183) * uVar183;
    uVar181 = (-1 < (short)uVar181) * uVar181;
    uVar173 = (-1 < (short)uVar173) * uVar173;
    uVar131 = (-1 < (short)uVar131) * uVar131;
    uVar130 = (-1 < (short)uVar130) * uVar130;
    auVar106 = paddsw(auVar177,auVar76);
    auVar66 = pmulhw(auVar106,auVar65);
    auVar107._0_2_ = auVar66._0_2_ + auVar106._0_2_;
    auVar107._2_2_ = auVar66._2_2_ + auVar106._2_2_;
    auVar107._4_2_ = auVar66._4_2_ + auVar106._4_2_;
    auVar107._6_2_ = auVar66._6_2_ + auVar106._6_2_;
    auVar107._8_2_ = auVar66._8_2_ + auVar106._8_2_;
    auVar107._10_2_ = auVar66._10_2_ + auVar106._10_2_;
    auVar107._12_2_ = auVar66._12_2_ + auVar106._12_2_;
    auVar107._14_2_ = auVar66._14_2_ + auVar106._14_2_;
    sVar141 = auVar134._8_2_;
    sVar118 = auVar134._10_2_;
    sVar122 = auVar134._12_2_;
    sVar146 = auVar134._14_2_;
    auVar66 = pmulhw(auVar107,auVar134);
    auVar104._0_2_ = (ushort)(auVar107._0_2_ * auVar134._0_2_) >> 0xf;
    auVar104._2_2_ = (ushort)(auVar107._2_2_ * auVar134._2_2_) >> 0xf;
    auVar104._4_2_ = (ushort)(auVar107._4_2_ * auVar134._4_2_) >> 0xf;
    auVar104._6_2_ = (ushort)(auVar107._6_2_ * auVar134._6_2_) >> 0xf;
    auVar104._8_2_ = (ushort)(auVar107._8_2_ * sVar141) >> 0xf;
    auVar104._10_2_ = (ushort)(auVar107._10_2_ * sVar118) >> 0xf;
    auVar104._12_2_ = (ushort)(auVar107._12_2_ * sVar122) >> 0xf;
    auVar104._14_2_ = (ushort)(auVar107._14_2_ * sVar146) >> 0xf;
    auVar108._2_2_ = auVar66._2_2_ * 2;
    auVar108._0_2_ = auVar66._0_2_ * 2;
    auVar108._4_2_ = auVar66._4_2_ * 2;
    auVar108._6_2_ = auVar66._6_2_ * 2;
    auVar108._8_2_ = auVar66._8_2_ * 2;
    auVar108._10_2_ = auVar66._10_2_ * 2;
    auVar108._12_2_ = auVar66._12_2_ * 2;
    auVar108._14_2_ = auVar66._14_2_ * 2;
    auVar154._4_4_ = uVar101;
    auVar154._0_4_ = uVar97;
    auVar154._8_4_ = uVar97;
    auVar154._12_4_ = uVar101;
    local_68._8_4_ = auVar65._8_4_;
    local_68._12_4_ = auVar65._12_4_;
    auVar105._8_4_ = auVar134._8_4_;
    auVar105._12_4_ = auVar134._12_4_;
    auVar65 = paddsw(auVar192,auVar154);
    auVar66 = pmulhw(auVar65,local_68);
    auVar203._0_2_ = auVar66._0_2_ + auVar65._0_2_;
    auVar203._2_2_ = auVar66._2_2_ + auVar65._2_2_;
    auVar203._4_2_ = auVar66._4_2_ + auVar65._4_2_;
    auVar203._6_2_ = auVar66._6_2_ + auVar65._6_2_;
    auVar203._8_2_ = auVar66._8_2_ + auVar65._8_2_;
    auVar203._10_2_ = auVar66._10_2_ + auVar65._10_2_;
    auVar203._12_2_ = auVar66._12_2_ + auVar65._12_2_;
    auVar203._14_2_ = auVar66._14_2_ + auVar65._14_2_;
    auVar65 = pmulhw(auVar203,auVar105);
    auVar164._0_2_ = (ushort)(auVar203._0_2_ * sVar141) >> 0xf;
    auVar164._2_2_ = (ushort)(auVar203._2_2_ * sVar118) >> 0xf;
    auVar164._4_2_ = (ushort)(auVar203._4_2_ * sVar122) >> 0xf;
    auVar164._6_2_ = (ushort)(auVar203._6_2_ * sVar146) >> 0xf;
    auVar164._8_2_ = (ushort)(auVar203._8_2_ * sVar141) >> 0xf;
    auVar164._10_2_ = (ushort)(auVar203._10_2_ * sVar118) >> 0xf;
    auVar164._12_2_ = (ushort)(auVar203._12_2_ * sVar122) >> 0xf;
    auVar164._14_2_ = (ushort)(auVar203._14_2_ * sVar146) >> 0xf;
    auVar204._2_2_ = auVar65._2_2_ * 2;
    auVar204._0_2_ = auVar65._0_2_ * 2;
    auVar204._4_2_ = auVar65._4_2_ * 2;
    auVar204._6_2_ = auVar65._6_2_ * 2;
    auVar204._8_2_ = auVar65._8_2_ * 2;
    auVar204._10_2_ = auVar65._10_2_ * 2;
    auVar204._12_2_ = auVar65._12_2_ * 2;
    auVar204._14_2_ = auVar65._14_2_ * 2;
    auVar65 = (auVar108 | auVar104) ^ auVar165;
    auVar125._0_2_ = auVar65._0_2_ - auVar165._0_2_;
    auVar125._2_2_ = auVar65._2_2_ - auVar165._2_2_;
    auVar125._4_2_ = auVar65._4_2_ - auVar165._4_2_;
    auVar125._6_2_ = auVar65._6_2_ - auVar165._6_2_;
    auVar125._8_2_ = auVar65._8_2_ - auVar165._8_2_;
    auVar125._10_2_ = auVar65._10_2_ - auVar165._10_2_;
    auVar125._12_2_ = auVar65._12_2_ - auVar165._12_2_;
    auVar125._14_2_ = auVar65._14_2_ - auVar165._14_2_;
    auVar65 = (auVar204 | auVar164) ^ auVar155;
    auVar205._0_2_ = auVar65._0_2_ - auVar155._0_2_;
    auVar205._2_2_ = auVar65._2_2_ - auVar155._2_2_;
    auVar205._4_2_ = auVar65._4_2_ - auVar155._4_2_;
    auVar205._6_2_ = auVar65._6_2_ - auVar155._6_2_;
    auVar205._8_2_ = auVar65._8_2_ - auVar155._8_2_;
    auVar205._10_2_ = auVar65._10_2_ - auVar155._10_2_;
    auVar205._12_2_ = auVar65._12_2_ - auVar155._12_2_;
    auVar205._14_2_ = auVar65._14_2_ - auVar155._14_2_;
    auVar125 = ~auVar124 & auVar125;
    auVar205 = auVar205 & auVar216;
    auVar65 = psraw(auVar125,0xf);
    sVar93 = auVar125._6_2_;
    auVar165._0_12_ = auVar125._0_12_;
    auVar165._12_2_ = sVar93;
    auVar165._14_2_ = auVar65._6_2_;
    auVar79._12_4_ = auVar165._12_4_;
    auVar79._0_10_ = auVar125._0_10_;
    auVar79._10_2_ = auVar65._4_2_;
    sVar92 = auVar125._4_2_;
    auVar78._10_6_ = auVar79._10_6_;
    auVar78._0_8_ = auVar125._0_8_;
    auVar78._8_2_ = sVar92;
    auVar77._8_8_ = auVar78._8_8_;
    auVar77._6_2_ = auVar65._2_2_;
    sVar71 = auVar125._2_2_;
    auVar77._4_2_ = sVar71;
    auVar77._0_2_ = auVar125._0_2_;
    auVar77._2_2_ = auVar65._0_2_;
    sVar95 = auVar125._8_2_;
    sVar96 = auVar125._10_2_;
    uVar187 = auVar65._10_2_;
    sVar99 = auVar125._12_2_;
    uVar189 = auVar65._12_2_;
    sVar100 = auVar125._14_2_;
    uVar195 = auVar65._14_2_;
    *(undefined1 (*) [16])qcoeff_ptr = auVar77;
    *(short *)(qcoeff_ptr + 4) = sVar95;
    *(ushort *)((long)qcoeff_ptr + 0x12) = auVar65._8_2_;
    *(short *)(qcoeff_ptr + 5) = sVar96;
    *(ushort *)((long)qcoeff_ptr + 0x16) = uVar187;
    *(short *)(qcoeff_ptr + 6) = sVar99;
    *(ushort *)((long)qcoeff_ptr + 0x1a) = uVar189;
    *(short *)(qcoeff_ptr + 7) = sVar100;
    *(ushort *)((long)qcoeff_ptr + 0x1e) = uVar195;
    sVar103 = auVar205._0_2_;
    sVar141 = -sVar103;
    sVar209 = auVar205._2_2_;
    sVar118 = -sVar209;
    sVar210 = auVar205._4_2_;
    sVar122 = -sVar210;
    sVar211 = auVar205._6_2_;
    sVar146 = -sVar211;
    sVar212 = auVar205._8_2_;
    sVar151 = -sVar212;
    sVar213 = auVar205._10_2_;
    sVar2 = -sVar213;
    sVar214 = auVar205._12_2_;
    sVar3 = -sVar214;
    sVar215 = auVar205._14_2_;
    sVar4 = -sVar215;
    auVar109._0_2_ = (ushort)(sVar141 < sVar103) * sVar103 | (ushort)(sVar141 >= sVar103) * sVar141;
    auVar109._2_2_ = (ushort)(sVar118 < sVar209) * sVar209 | (ushort)(sVar118 >= sVar209) * sVar118;
    auVar109._4_2_ = (ushort)(sVar122 < sVar210) * sVar210 | (ushort)(sVar122 >= sVar210) * sVar122;
    auVar109._6_2_ = (ushort)(sVar146 < sVar211) * sVar211 | (ushort)(sVar146 >= sVar211) * sVar146;
    auVar109._8_2_ = (ushort)(sVar151 < sVar212) * sVar212 | (ushort)(sVar151 >= sVar212) * sVar151;
    auVar109._10_2_ = (ushort)(sVar2 < sVar213) * sVar213 | (ushort)(sVar2 >= sVar213) * sVar2;
    auVar109._12_2_ = (ushort)(sVar3 < sVar214) * sVar214 | (ushort)(sVar3 >= sVar214) * sVar3;
    auVar109._14_2_ = (ushort)(sVar4 < sVar215) * sVar215 | (ushort)(sVar4 >= sVar215) * sVar4;
    auVar66 = psraw(auVar205,0xf);
    auVar83._0_12_ = auVar205._0_12_;
    auVar83._12_2_ = sVar211;
    auVar83._14_2_ = auVar66._6_2_;
    auVar82._12_4_ = auVar83._12_4_;
    auVar82._0_10_ = auVar205._0_10_;
    auVar82._10_2_ = auVar66._4_2_;
    auVar81._10_6_ = auVar82._10_6_;
    auVar81._0_8_ = auVar205._0_8_;
    auVar81._8_2_ = sVar210;
    auVar80._8_8_ = auVar81._8_8_;
    auVar80._6_2_ = auVar66._2_2_;
    auVar80._4_2_ = sVar209;
    auVar80._2_2_ = auVar66._0_2_;
    auVar80._0_2_ = sVar103;
    uVar197 = auVar66._10_2_;
    uVar199 = auVar66._12_2_;
    uVar201 = auVar66._14_2_;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar80;
    *(short *)(qcoeff_ptr + 0xc) = sVar212;
    *(ushort *)((long)qcoeff_ptr + 0x32) = auVar66._8_2_;
    *(short *)(qcoeff_ptr + 0xd) = sVar213;
    *(ushort *)((long)qcoeff_ptr + 0x36) = uVar197;
    *(short *)(qcoeff_ptr + 0xe) = sVar214;
    *(ushort *)((long)qcoeff_ptr + 0x3a) = uVar199;
    *(short *)(qcoeff_ptr + 0xf) = sVar215;
    *(ushort *)((long)qcoeff_ptr + 0x3e) = uVar201;
    sVar141 = -auVar77._0_2_;
    sVar118 = -sVar71;
    sVar122 = -sVar92;
    sVar146 = -sVar93;
    sVar151 = -sVar95;
    sVar2 = -sVar96;
    sVar3 = -sVar99;
    sVar4 = -sVar100;
    auVar84._0_2_ =
         (ushort)(sVar141 < auVar77._0_2_) * auVar77._0_2_ |
         (ushort)(sVar141 >= auVar77._0_2_) * sVar141;
    auVar84._2_2_ = (ushort)(sVar118 < sVar71) * sVar71 | (ushort)(sVar118 >= sVar71) * sVar118;
    auVar84._4_2_ = (ushort)(sVar122 < sVar92) * sVar92 | (ushort)(sVar122 >= sVar92) * sVar122;
    auVar84._6_2_ = (ushort)(sVar146 < sVar93) * sVar93 | (ushort)(sVar146 >= sVar93) * sVar146;
    auVar84._8_2_ = (ushort)(sVar151 < sVar95) * sVar95 | (ushort)(sVar151 >= sVar95) * sVar151;
    auVar84._10_2_ = (ushort)(sVar2 < sVar96) * sVar96 | (ushort)(sVar2 >= sVar96) * sVar2;
    auVar84._12_2_ = (ushort)(sVar3 < sVar99) * sVar99 | (ushort)(sVar3 >= sVar99) * sVar3;
    auVar84._14_2_ = (ushort)(sVar4 < sVar100) * sVar100 | (ushort)(sVar4 >= sVar100) * sVar4;
    auVar12._10_2_ = 0;
    auVar12._0_10_ = auVar65._0_10_;
    auVar12._12_2_ = auVar65._6_2_;
    auVar19._8_2_ = auVar65._4_2_;
    auVar19._0_8_ = auVar65._0_8_;
    auVar19._10_4_ = auVar12._10_4_;
    auVar44._6_8_ = 0;
    auVar44._0_6_ = auVar19._8_6_;
    Var45 = CONCAT82(SUB148(auVar44 << 0x40,6),auVar65._2_2_);
    auVar126._0_4_ = CONCAT22(0,auVar65._0_2_);
    auVar126._4_10_ = Var45;
    auVar126._14_2_ = 0;
    auVar156._0_4_ = CONCAT22(0,auVar65._8_2_);
    auVar156._4_2_ = uVar187;
    auVar156._6_2_ = 0;
    auVar156._8_2_ = uVar189;
    auVar156._10_2_ = 0;
    auVar156._12_2_ = uVar195;
    auVar156._14_2_ = 0;
    sVar141 = auVar84._6_2_ * auVar119._6_2_;
    sVar118 = auVar119._8_2_;
    sVar122 = auVar119._10_2_;
    sVar146 = auVar119._12_2_;
    sVar151 = auVar119._14_2_;
    auVar65 = pmulhw(auVar84,auVar119);
    uVar59 = CONCAT22(auVar65._6_2_,sVar141);
    Var55 = CONCAT64(CONCAT42(uVar59,auVar65._4_2_),CONCAT22(auVar84._4_2_ * auVar119._4_2_,sVar141)
                    );
    auVar46._4_8_ = (long)((unkuint10)Var55 >> 0x10);
    auVar46._2_2_ = auVar65._2_2_;
    auVar46._0_2_ = auVar84._2_2_ * auVar119._2_2_;
    uVar72 = CONCAT22(auVar65._8_2_,auVar84._8_2_ * sVar118);
    auVar133._0_8_ = CONCAT26(auVar65._10_2_,CONCAT24(auVar84._10_2_ * sVar122,uVar72));
    auVar133._8_2_ = auVar84._12_2_ * sVar146;
    auVar133._10_2_ = auVar65._12_2_;
    auVar135._12_2_ = auVar84._14_2_ * sVar151;
    auVar135._0_12_ = auVar133;
    auVar135._14_2_ = auVar65._14_2_;
    auVar166._0_4_ = CONCAT22(auVar65._0_2_,auVar84._0_2_ * auVar119._0_2_) >> 1;
    auVar166._4_4_ = auVar46._0_4_ >> 1;
    auVar166._8_4_ = (uint)((unkuint10)Var55 >> 0x10) >> 1;
    auVar166._12_4_ = uVar59 >> 1;
    auVar136._0_4_ = uVar72 >> 1;
    auVar136._4_4_ = (uint)((ulong)auVar133._0_8_ >> 0x21);
    auVar136._8_4_ = auVar133._8_4_ >> 1;
    auVar136._12_4_ = auVar135._12_4_ >> 1;
    auVar166 = auVar166 ^ auVar126;
    auVar136 = auVar136 ^ auVar156;
    *dqcoeff_ptr = auVar166._0_4_ - auVar126._0_4_;
    dqcoeff_ptr[1] = auVar166._4_4_ - (int)Var45;
    dqcoeff_ptr[2] = auVar166._8_4_ - auVar19._8_4_;
    dqcoeff_ptr[3] = auVar166._12_4_ - (auVar12._10_4_ >> 0x10);
    dqcoeff_ptr[4] = auVar136._0_4_ - auVar156._0_4_;
    dqcoeff_ptr[5] = auVar136._4_4_ - (uint)uVar187;
    dqcoeff_ptr[6] = auVar136._8_4_ - (uint)uVar189;
    dqcoeff_ptr[7] = auVar136._12_4_ - (uint)uVar195;
    auVar127._8_4_ = auVar119._8_4_;
    auVar127._12_4_ = auVar119._12_4_;
    auVar13._10_2_ = 0;
    auVar13._0_10_ = auVar66._0_10_;
    auVar13._12_2_ = auVar66._6_2_;
    auVar20._8_2_ = auVar66._4_2_;
    auVar20._0_8_ = auVar66._0_8_;
    auVar20._10_4_ = auVar13._10_4_;
    auVar47._6_8_ = 0;
    auVar47._0_6_ = auVar20._8_6_;
    Var45 = CONCAT82(SUB148(auVar47 << 0x40,6),auVar66._2_2_);
    auVar137._0_4_ = CONCAT22(0,auVar66._0_2_);
    auVar137._4_10_ = Var45;
    auVar137._14_2_ = 0;
    auVar206._0_4_ = CONCAT22(0,auVar66._8_2_);
    auVar206._4_2_ = uVar197;
    auVar206._6_2_ = 0;
    auVar206._8_2_ = uVar199;
    auVar206._10_2_ = 0;
    auVar206._12_2_ = uVar201;
    auVar206._14_2_ = 0;
    auVar65 = pmulhw(auVar109,auVar127);
    uVar59 = CONCAT22(auVar65._6_2_,auVar109._6_2_ * sVar151);
    Var55 = CONCAT64(CONCAT42(uVar59,auVar65._4_2_),
                     CONCAT22(auVar109._4_2_ * sVar146,auVar109._6_2_ * sVar151));
    auVar48._4_8_ = (long)((unkuint10)Var55 >> 0x10);
    auVar48._2_2_ = auVar65._2_2_;
    auVar48._0_2_ = auVar109._2_2_ * sVar122;
    uVar72 = CONCAT22(auVar65._8_2_,auVar109._8_2_ * sVar118);
    auVar75._0_8_ = CONCAT26(auVar65._10_2_,CONCAT24(auVar109._10_2_ * sVar122,uVar72));
    auVar75._8_2_ = auVar109._12_2_ * sVar146;
    auVar75._10_2_ = auVar65._12_2_;
    auVar85._12_2_ = auVar109._14_2_ * sVar151;
    auVar85._0_12_ = auVar75;
    auVar85._14_2_ = auVar65._14_2_;
    auVar157._0_4_ = CONCAT22(auVar65._0_2_,auVar109._0_2_ * sVar118) >> 1;
    auVar157._4_4_ = auVar48._0_4_ >> 1;
    auVar157._8_4_ = (uint)((unkuint10)Var55 >> 0x10) >> 1;
    auVar157._12_4_ = uVar59 >> 1;
    auVar86._0_4_ = uVar72 >> 1;
    auVar86._4_4_ = (uint)((ulong)auVar75._0_8_ >> 0x21);
    auVar86._8_4_ = auVar75._8_4_ >> 1;
    auVar86._12_4_ = auVar85._12_4_ >> 1;
    auVar157 = auVar157 ^ auVar137;
    iVar152 = auVar157._0_4_ - auVar137._0_4_;
    iVar161 = auVar157._4_4_ - (int)Var45;
    iVar162 = auVar157._8_4_ - auVar20._8_4_;
    iVar163 = auVar157._12_4_ - (auVar13._10_4_ >> 0x10);
    auVar86 = auVar86 ^ auVar206;
    iVar73 = auVar86._0_4_ - auVar206._0_4_;
    iVar94 = auVar86._4_4_ - (uint)uVar197;
    iVar98 = auVar86._8_4_ - (uint)uVar199;
    iVar102 = auVar86._12_4_ - (uint)uVar201;
  }
  bVar57 = ((((((((((((((!bVar40 || !bVar41) || !bVar39) || !bVar38) || !bVar37) || !bVar36) ||
                   !bVar35) || !bVar34) || !bVar33) || !bVar32) || !bVar31) || !bVar30) || !bVar29)
            || !bVar27) || !bVar18) || !bVar57;
  uVar132 = (-1 < (short)uVar132) * uVar132;
  uVar138 = (-1 < (short)uVar138) * uVar138;
  uVar139 = (-1 < (short)uVar139) * uVar139;
  uVar140 = (-1 < (short)uVar140) * uVar140;
  uVar142 = (-1 < (short)uVar142) * uVar142;
  uVar143 = (-1 < (short)uVar143) * uVar143;
  uVar144 = (-1 < (short)uVar144) * uVar144;
  uVar145 = (-1 < (short)uVar145) * uVar145;
  dqcoeff_ptr[8] = iVar152;
  dqcoeff_ptr[9] = iVar161;
  dqcoeff_ptr[10] = iVar162;
  dqcoeff_ptr[0xb] = iVar163;
  dqcoeff_ptr[0xc] = iVar73;
  dqcoeff_ptr[0xd] = iVar94;
  dqcoeff_ptr[0xe] = iVar98;
  dqcoeff_ptr[0xf] = iVar102;
  if (0x10 < n_coeffs) {
    iVar73 = 0x10;
    lVar61 = 0x10;
    bVar18 = bVar57;
    do {
      bVar57 = bVar18;
      lVar62 = (long)iVar73;
      while( true ) {
        iVar73 = iVar73 + 0x10;
        auVar66 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar61),
                           *(undefined1 (*) [16])(coeff_ptr + lVar61 + 4));
        auVar134 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar61 + 8),
                            *(undefined1 (*) [16])(coeff_ptr + lVar61 + 0xc));
        uVar187 = 0;
        uVar189 = 0;
        uVar195 = 0;
        uVar197 = 0;
        uVar199 = 0;
        uVar201 = 0;
        uVar121 = 0;
        uVar123 = 0;
        sVar71 = auVar66._0_2_;
        sVar141 = -sVar71;
        sVar92 = auVar66._2_2_;
        sVar118 = -sVar92;
        sVar93 = auVar66._4_2_;
        sVar122 = -sVar93;
        sVar95 = auVar66._6_2_;
        sVar146 = -sVar95;
        sVar96 = auVar66._8_2_;
        sVar151 = -sVar96;
        sVar99 = auVar66._10_2_;
        sVar2 = -sVar99;
        sVar100 = auVar66._12_2_;
        sVar3 = -sVar100;
        sVar103 = auVar66._14_2_;
        sVar4 = -sVar103;
        uVar190 = (ushort)(sVar141 < sVar71) * sVar71 | (ushort)(sVar141 >= sVar71) * sVar141;
        uVar196 = (ushort)(sVar118 < sVar92) * sVar92 | (ushort)(sVar118 >= sVar92) * sVar118;
        uVar198 = (ushort)(sVar122 < sVar93) * sVar93 | (ushort)(sVar122 >= sVar93) * sVar122;
        uVar200 = (ushort)(sVar146 < sVar95) * sVar95 | (ushort)(sVar146 >= sVar95) * sVar146;
        uVar191 = CONCAT26(uVar200,CONCAT24(uVar198,CONCAT22(uVar196,uVar190)));
        uVar202 = (ushort)(sVar151 < sVar96) * sVar96 | (ushort)(sVar151 >= sVar96) * sVar151;
        auVar193._0_10_ = CONCAT28(uVar202,uVar191);
        auVar193._10_2_ = (ushort)(sVar2 < sVar99) * sVar99 | (ushort)(sVar2 >= sVar99) * sVar2;
        auVar193._12_2_ = (ushort)(sVar3 < sVar100) * sVar100 | (ushort)(sVar3 >= sVar100) * sVar3;
        auVar193._14_2_ = (ushort)(sVar4 < sVar103) * sVar103 | (ushort)(sVar4 >= sVar103) * sVar4;
        sVar71 = auVar134._0_2_;
        sVar141 = -sVar71;
        sVar92 = auVar134._2_2_;
        sVar118 = -sVar92;
        sVar93 = auVar134._4_2_;
        sVar122 = -sVar93;
        sVar95 = auVar134._6_2_;
        sVar146 = -sVar95;
        sVar96 = auVar134._8_2_;
        sVar151 = -sVar96;
        sVar99 = auVar134._10_2_;
        sVar2 = -sVar99;
        sVar100 = auVar134._12_2_;
        sVar3 = -sVar100;
        sVar103 = auVar134._14_2_;
        sVar4 = -sVar103;
        uVar174 = (ushort)(sVar141 < sVar71) * sVar71 | (ushort)(sVar141 >= sVar71) * sVar141;
        uVar182 = (ushort)(sVar118 < sVar92) * sVar92 | (ushort)(sVar118 >= sVar92) * sVar118;
        uVar184 = (ushort)(sVar122 < sVar93) * sVar93 | (ushort)(sVar122 >= sVar93) * sVar122;
        uVar186 = (ushort)(sVar146 < sVar95) * sVar95 | (ushort)(sVar146 >= sVar95) * sVar146;
        uVar175 = CONCAT26(uVar186,CONCAT24(uVar184,CONCAT22(uVar182,uVar174)));
        uVar188 = (ushort)(sVar151 < sVar96) * sVar96 | (ushort)(sVar151 >= sVar96) * sVar151;
        auVar178._0_10_ = CONCAT28(uVar188,uVar175);
        auVar178._10_2_ = (ushort)(sVar2 < sVar99) * sVar99 | (ushort)(sVar2 >= sVar99) * sVar2;
        auVar178._12_2_ = (ushort)(sVar3 < sVar100) * sVar100 | (ushort)(sVar3 >= sVar100) * sVar3;
        auVar178._14_2_ = (ushort)(sVar4 < sVar103) * sVar103 | (ushort)(sVar4 >= sVar103) * sVar4;
        auVar14._10_2_ = 0;
        auVar14._0_10_ = auVar193._0_10_;
        auVar14._12_2_ = uVar200;
        auVar21._8_2_ = uVar198;
        auVar21._0_8_ = uVar191;
        auVar21._10_4_ = auVar14._10_4_;
        auVar49._6_8_ = 0;
        auVar49._0_6_ = auVar21._8_6_;
        auVar28._4_2_ = uVar196;
        auVar28._0_4_ = CONCAT22(uVar196,uVar190);
        auVar28._6_8_ = SUB148(auVar49 << 0x40,6);
        auVar7._10_2_ = 0;
        auVar7._0_10_ = auVar178._0_10_;
        auVar7._12_2_ = uVar186;
        auVar15._8_2_ = uVar184;
        auVar15._0_8_ = uVar175;
        auVar15._10_4_ = auVar7._10_4_;
        auVar50._6_8_ = 0;
        auVar50._0_6_ = auVar15._8_6_;
        auVar24._4_2_ = uVar182;
        auVar24._0_4_ = CONCAT22(uVar182,uVar174);
        auVar24._6_8_ = SUB148(auVar50 << 0x40,6);
        auVar110._0_4_ = -(uint)(aiStack_84[0] < (int)((uint)uVar190 << 5));
        auVar110._4_4_ = -(uint)(aiStack_84[0] < auVar28._4_4_ << 5);
        auVar110._8_4_ = -(uint)(aiStack_84[0] < auVar21._8_4_ << 5);
        auVar110._12_4_ = -(uint)(aiStack_84[0] < (int)((auVar14._10_4_ >> 0x10) << 5));
        auVar207._0_4_ = -(uint)(aiStack_84[0] < (int)((uint)uVar202 << 5));
        auVar207._4_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar193._10_2_ << 5));
        auVar207._8_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar193._12_2_ << 5));
        auVar207._12_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar193._14_2_ << 5));
        auVar65 = packssdw(auVar110,auVar207);
        auVar120._0_4_ = -(uint)(aiStack_84[0] < (int)((uint)uVar174 << 5));
        auVar120._4_4_ = -(uint)(aiStack_84[0] < auVar24._4_4_ << 5);
        auVar120._8_4_ = -(uint)(aiStack_84[0] < auVar15._8_4_ << 5);
        auVar120._12_4_ = -(uint)(aiStack_84[0] < (int)((auVar7._10_4_ >> 0x10) << 5));
        auVar217._0_4_ = -(uint)(aiStack_84[0] < (int)((uint)uVar188 << 5));
        auVar217._4_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar178._10_2_ << 5));
        auVar217._8_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar178._12_2_ << 5));
        auVar217._12_4_ = -(uint)(aiStack_84[0] < (int)((uint)auVar178._14_2_ << 5));
        auVar119 = packssdw(auVar120,auVar217);
        auVar106 = auVar119 | auVar65;
        if ((((((((((((((((auVar106 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar106 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar106 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar106 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar106 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar106 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar106 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar106 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar106 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar106 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar106 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar106 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar106 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar106 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar106 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar106[0xf] < '\0') {
          auVar65 = auVar65 & *(undefined1 (*) [16])(iscan + lVar61);
          auVar119 = auVar119 & *(undefined1 (*) [16])(iscan + lVar61 + 8);
          sVar141 = auVar65._0_2_;
          sVar118 = auVar119._0_2_;
          uVar187 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
          sVar141 = auVar65._2_2_;
          sVar118 = auVar119._2_2_;
          uVar189 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
          sVar141 = auVar65._4_2_;
          sVar118 = auVar119._4_2_;
          uVar195 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
          sVar141 = auVar65._6_2_;
          sVar118 = auVar119._6_2_;
          uVar197 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
          sVar141 = auVar65._8_2_;
          sVar118 = auVar119._8_2_;
          uVar199 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
          sVar141 = auVar65._10_2_;
          sVar118 = auVar119._10_2_;
          uVar201 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
          sVar141 = auVar65._12_2_;
          sVar118 = auVar119._12_2_;
          sVar122 = auVar119._14_2_;
          uVar121 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
          sVar141 = auVar65._14_2_;
          uVar123 = (ushort)(sVar122 < sVar141) * sVar141 | (ushort)(sVar122 >= sVar141) * sVar122;
          bVar56 = true;
        }
        uVar132 = ((short)uVar132 < (short)uVar187) * uVar187 |
                  ((short)uVar132 >= (short)uVar187) * uVar132;
        uVar138 = ((short)uVar138 < (short)uVar189) * uVar189 |
                  ((short)uVar138 >= (short)uVar189) * uVar138;
        uVar139 = ((short)uVar139 < (short)uVar195) * uVar195 |
                  ((short)uVar139 >= (short)uVar195) * uVar139;
        uVar140 = ((short)uVar140 < (short)uVar197) * uVar197 |
                  ((short)uVar140 >= (short)uVar197) * uVar140;
        uVar142 = ((short)uVar142 < (short)uVar199) * uVar199 |
                  ((short)uVar142 >= (short)uVar199) * uVar142;
        uVar143 = ((short)uVar143 < (short)uVar201) * uVar201 |
                  ((short)uVar143 >= (short)uVar201) * uVar143;
        uVar144 = ((short)uVar144 < (short)uVar121) * uVar121 |
                  ((short)uVar144 >= (short)uVar121) * uVar144;
        uVar145 = ((short)uVar145 < (short)uVar123) * uVar123 |
                  ((short)uVar145 >= (short)uVar123) * uVar145;
        auVar208._0_2_ = -(ushort)(sVar67 < (short)uVar190);
        auVar208._2_2_ = -(ushort)(sVar68 < (short)uVar196);
        auVar208._4_2_ = -(ushort)(sVar69 < (short)uVar198);
        auVar208._6_2_ = -(ushort)(sVar70 < (short)uVar200);
        auVar208._8_2_ = -(ushort)(sVar67 < (short)uVar202);
        auVar208._10_2_ = -(ushort)(sVar68 < (short)auVar193._10_2_);
        auVar208._12_2_ = -(ushort)(sVar69 < (short)auVar193._12_2_);
        auVar208._14_2_ = -(ushort)(sVar70 < (short)auVar193._14_2_);
        auVar218._0_2_ = -(ushort)(sVar67 < (short)uVar174);
        auVar218._2_2_ = -(ushort)(sVar68 < (short)uVar182);
        auVar218._4_2_ = -(ushort)(sVar69 < (short)uVar184);
        auVar218._6_2_ = -(ushort)(sVar70 < (short)uVar186);
        auVar218._8_2_ = -(ushort)(sVar67 < (short)uVar188);
        auVar218._10_2_ = -(ushort)(sVar68 < (short)auVar178._10_2_);
        auVar218._12_2_ = -(ushort)(sVar69 < (short)auVar178._12_2_);
        auVar218._14_2_ = -(ushort)(sVar70 < (short)auVar178._14_2_);
        auVar65 = auVar218 | auVar208;
        if ((((((((((((((((auVar65 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar65 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar65 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar65 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar65 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar65 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar65 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar65 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar65 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar65 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar65 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar65 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar65[0xf] < '\0') break;
        uVar129 = (-1 < (short)uVar129) * uVar129;
        uVar128 = (-1 < (short)uVar128) * uVar128;
        uVar185 = (-1 < (short)uVar185) * uVar185;
        uVar183 = (-1 < (short)uVar183) * uVar183;
        uVar181 = (-1 < (short)uVar181) * uVar181;
        uVar173 = (-1 < (short)uVar173) * uVar173;
        uVar131 = (-1 < (short)uVar131) * uVar131;
        uVar130 = (-1 < (short)uVar130) * uVar130;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar61 + 0xc) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar61 + 8) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar61 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar61) = (undefined1  [16])0x0;
        lVar62 = lVar62 + 0x10;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar61 + 0xc) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar61 + 8) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar61 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar61) = (undefined1  [16])0x0;
        lVar61 = lVar62;
        if (n_coeffs <= lVar62) goto LAB_00924212;
      }
      auVar66 = psraw(auVar66,0xf);
      auVar134 = psraw(auVar134,0xf);
      auVar65 = *(undefined1 (*) [16])(iscan + lVar61) & auVar208;
      auVar119 = *(undefined1 (*) [16])(iscan + lVar61 + 8) & auVar218;
      sVar141 = auVar65._0_2_;
      sVar118 = auVar119._0_2_;
      uVar187 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
      sVar141 = auVar65._2_2_;
      sVar118 = auVar119._2_2_;
      uVar189 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
      sVar141 = auVar65._4_2_;
      sVar118 = auVar119._4_2_;
      uVar195 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
      sVar141 = auVar65._6_2_;
      sVar118 = auVar119._6_2_;
      uVar197 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
      sVar141 = auVar65._8_2_;
      sVar118 = auVar119._8_2_;
      uVar199 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
      sVar141 = auVar65._10_2_;
      sVar118 = auVar119._10_2_;
      uVar201 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
      sVar141 = auVar65._12_2_;
      sVar118 = auVar119._12_2_;
      sVar122 = auVar119._14_2_;
      uVar121 = (ushort)(sVar118 < sVar141) * sVar141 | (ushort)(sVar118 >= sVar141) * sVar118;
      sVar141 = auVar65._14_2_;
      uVar123 = (ushort)(sVar122 < sVar141) * sVar141 | (ushort)(sVar122 >= sVar141) * sVar122;
      uVar129 = ((short)uVar187 < (short)uVar129) * uVar129 |
                ((short)uVar187 >= (short)uVar129) * uVar187;
      uVar128 = ((short)uVar189 < (short)uVar128) * uVar128 |
                ((short)uVar189 >= (short)uVar128) * uVar189;
      uVar185 = ((short)uVar195 < (short)uVar185) * uVar185 |
                ((short)uVar195 >= (short)uVar185) * uVar195;
      uVar183 = ((short)uVar197 < (short)uVar183) * uVar183 |
                ((short)uVar197 >= (short)uVar183) * uVar197;
      uVar181 = ((short)uVar199 < (short)uVar181) * uVar181 |
                ((short)uVar199 >= (short)uVar181) * uVar199;
      uVar173 = ((short)uVar201 < (short)uVar173) * uVar173 |
                ((short)uVar201 >= (short)uVar173) * uVar201;
      uVar131 = ((short)uVar121 < (short)uVar131) * uVar131 |
                ((short)uVar121 >= (short)uVar131) * uVar121;
      uVar130 = ((short)uVar123 < (short)uVar130) * uVar130 |
                ((short)uVar123 >= (short)uVar130) * uVar123;
      auVar119 = paddsw(auVar193,auVar154);
      auVar65 = pmulhw(auVar119,local_68);
      auVar87._0_2_ = auVar65._0_2_ + auVar119._0_2_;
      auVar87._2_2_ = auVar65._2_2_ + auVar119._2_2_;
      auVar87._4_2_ = auVar65._4_2_ + auVar119._4_2_;
      auVar87._6_2_ = auVar65._6_2_ + auVar119._6_2_;
      auVar87._8_2_ = auVar65._8_2_ + auVar119._8_2_;
      auVar87._10_2_ = auVar65._10_2_ + auVar119._10_2_;
      auVar87._12_2_ = auVar65._12_2_ + auVar119._12_2_;
      auVar87._14_2_ = auVar65._14_2_ + auVar119._14_2_;
      auVar65 = pmulhw(auVar87,auVar105);
      auVar111._0_2_ = (ushort)(auVar87._0_2_ * auVar105._0_2_) >> 0xf;
      auVar111._2_2_ = (ushort)(auVar87._2_2_ * auVar105._2_2_) >> 0xf;
      auVar111._4_2_ = (ushort)(auVar87._4_2_ * auVar105._4_2_) >> 0xf;
      auVar111._6_2_ = (ushort)(auVar87._6_2_ * auVar105._6_2_) >> 0xf;
      auVar111._8_2_ = (ushort)(auVar87._8_2_ * auVar105._8_2_) >> 0xf;
      auVar111._10_2_ = (ushort)(auVar87._10_2_ * auVar105._10_2_) >> 0xf;
      auVar111._12_2_ = (ushort)(auVar87._12_2_ * auVar105._12_2_) >> 0xf;
      auVar111._14_2_ = (ushort)(auVar87._14_2_ * auVar105._14_2_) >> 0xf;
      auVar88._2_2_ = auVar65._2_2_ * 2;
      auVar88._0_2_ = auVar65._0_2_ * 2;
      auVar88._4_2_ = auVar65._4_2_ * 2;
      auVar88._6_2_ = auVar65._6_2_ * 2;
      auVar88._8_2_ = auVar65._8_2_ * 2;
      auVar88._10_2_ = auVar65._10_2_ * 2;
      auVar88._12_2_ = auVar65._12_2_ * 2;
      auVar88._14_2_ = auVar65._14_2_ * 2;
      auVar119 = paddsw(auVar178,auVar154);
      auVar65 = pmulhw(auVar119,local_68);
      auVar147._0_2_ = auVar65._0_2_ + auVar119._0_2_;
      auVar147._2_2_ = auVar65._2_2_ + auVar119._2_2_;
      auVar147._4_2_ = auVar65._4_2_ + auVar119._4_2_;
      auVar147._6_2_ = auVar65._6_2_ + auVar119._6_2_;
      auVar147._8_2_ = auVar65._8_2_ + auVar119._8_2_;
      auVar147._10_2_ = auVar65._10_2_ + auVar119._10_2_;
      auVar147._12_2_ = auVar65._12_2_ + auVar119._12_2_;
      auVar147._14_2_ = auVar65._14_2_ + auVar119._14_2_;
      auVar65 = pmulhw(auVar147,auVar105);
      auVar112._0_2_ = (ushort)(auVar147._0_2_ * auVar105._0_2_) >> 0xf;
      auVar112._2_2_ = (ushort)(auVar147._2_2_ * auVar105._2_2_) >> 0xf;
      auVar112._4_2_ = (ushort)(auVar147._4_2_ * auVar105._4_2_) >> 0xf;
      auVar112._6_2_ = (ushort)(auVar147._6_2_ * auVar105._6_2_) >> 0xf;
      auVar112._8_2_ = (ushort)(auVar147._8_2_ * auVar105._8_2_) >> 0xf;
      auVar112._10_2_ = (ushort)(auVar147._10_2_ * auVar105._10_2_) >> 0xf;
      auVar112._12_2_ = (ushort)(auVar147._12_2_ * auVar105._12_2_) >> 0xf;
      auVar112._14_2_ = (ushort)(auVar147._14_2_ * auVar105._14_2_) >> 0xf;
      auVar148._2_2_ = auVar65._2_2_ * 2;
      auVar148._0_2_ = auVar65._0_2_ * 2;
      auVar148._4_2_ = auVar65._4_2_ * 2;
      auVar148._6_2_ = auVar65._6_2_ * 2;
      auVar148._8_2_ = auVar65._8_2_ * 2;
      auVar148._10_2_ = auVar65._10_2_ * 2;
      auVar148._12_2_ = auVar65._12_2_ * 2;
      auVar148._14_2_ = auVar65._14_2_ * 2;
      auVar65 = (auVar88 | auVar111) ^ auVar66;
      auVar89._0_2_ = auVar65._0_2_ - auVar66._0_2_;
      auVar89._2_2_ = auVar65._2_2_ - auVar66._2_2_;
      auVar89._4_2_ = auVar65._4_2_ - auVar66._4_2_;
      auVar89._6_2_ = auVar65._6_2_ - auVar66._6_2_;
      auVar89._8_2_ = auVar65._8_2_ - auVar66._8_2_;
      auVar89._10_2_ = auVar65._10_2_ - auVar66._10_2_;
      auVar89._12_2_ = auVar65._12_2_ - auVar66._12_2_;
      auVar89._14_2_ = auVar65._14_2_ - auVar66._14_2_;
      auVar65 = (auVar148 | auVar112) ^ auVar134;
      auVar149._0_2_ = auVar65._0_2_ - auVar134._0_2_;
      auVar149._2_2_ = auVar65._2_2_ - auVar134._2_2_;
      auVar149._4_2_ = auVar65._4_2_ - auVar134._4_2_;
      auVar149._6_2_ = auVar65._6_2_ - auVar134._6_2_;
      auVar149._8_2_ = auVar65._8_2_ - auVar134._8_2_;
      auVar149._10_2_ = auVar65._10_2_ - auVar134._10_2_;
      auVar149._12_2_ = auVar65._12_2_ - auVar134._12_2_;
      auVar149._14_2_ = auVar65._14_2_ - auVar134._14_2_;
      auVar89 = auVar89 & auVar208;
      auVar149 = auVar149 & auVar218;
      sVar71 = auVar89._0_2_;
      sVar141 = -sVar71;
      sVar92 = auVar89._2_2_;
      sVar118 = -sVar92;
      sVar93 = auVar89._4_2_;
      sVar122 = -sVar93;
      sVar95 = auVar89._6_2_;
      sVar146 = -sVar95;
      sVar96 = auVar89._8_2_;
      sVar151 = -sVar96;
      sVar99 = auVar89._10_2_;
      sVar2 = -sVar99;
      sVar100 = auVar89._12_2_;
      sVar3 = -sVar100;
      sVar103 = auVar89._14_2_;
      sVar4 = -sVar103;
      auVar158._0_2_ = (ushort)(sVar141 < sVar71) * sVar71 | (ushort)(sVar141 >= sVar71) * sVar141;
      auVar158._2_2_ = (ushort)(sVar118 < sVar92) * sVar92 | (ushort)(sVar118 >= sVar92) * sVar118;
      auVar158._4_2_ = (ushort)(sVar122 < sVar93) * sVar93 | (ushort)(sVar122 >= sVar93) * sVar122;
      auVar158._6_2_ = (ushort)(sVar146 < sVar95) * sVar95 | (ushort)(sVar146 >= sVar95) * sVar146;
      auVar158._8_2_ = (ushort)(sVar151 < sVar96) * sVar96 | (ushort)(sVar151 >= sVar96) * sVar151;
      auVar158._10_2_ = (ushort)(sVar2 < sVar99) * sVar99 | (ushort)(sVar2 >= sVar99) * sVar2;
      auVar158._12_2_ = (ushort)(sVar3 < sVar100) * sVar100 | (ushort)(sVar3 >= sVar100) * sVar3;
      auVar158._14_2_ = (ushort)(sVar4 < sVar103) * sVar103 | (ushort)(sVar4 >= sVar103) * sVar4;
      auVar65 = psraw(auVar89,0xf);
      auVar116._0_12_ = auVar89._0_12_;
      auVar116._12_2_ = sVar95;
      auVar116._14_2_ = auVar65._6_2_;
      auVar115._12_4_ = auVar116._12_4_;
      auVar115._0_10_ = auVar89._0_10_;
      auVar115._10_2_ = auVar65._4_2_;
      auVar114._10_6_ = auVar115._10_6_;
      auVar114._0_8_ = auVar89._0_8_;
      auVar114._8_2_ = sVar93;
      auVar113._8_8_ = auVar114._8_8_;
      auVar113._6_2_ = auVar65._2_2_;
      auVar113._4_2_ = sVar92;
      auVar113._2_2_ = auVar65._0_2_;
      auVar113._0_2_ = sVar71;
      uVar187 = auVar65._10_2_;
      uVar189 = auVar65._12_2_;
      uVar195 = auVar65._14_2_;
      *(undefined1 (*) [16])(qcoeff_ptr + lVar61) = auVar113;
      ptVar1 = qcoeff_ptr + lVar61 + 4;
      *(short *)ptVar1 = sVar96;
      *(ushort *)((long)ptVar1 + 2) = auVar65._8_2_;
      *(short *)(ptVar1 + 1) = sVar99;
      *(ushort *)((long)ptVar1 + 6) = uVar187;
      *(short *)(ptVar1 + 2) = sVar100;
      *(ushort *)((long)ptVar1 + 10) = uVar189;
      *(short *)(ptVar1 + 3) = sVar103;
      *(ushort *)((long)ptVar1 + 0xe) = uVar195;
      sVar71 = auVar149._0_2_;
      sVar141 = -sVar71;
      sVar92 = auVar149._2_2_;
      sVar118 = -sVar92;
      sVar93 = auVar149._4_2_;
      sVar122 = -sVar93;
      sVar95 = auVar149._6_2_;
      sVar146 = -sVar95;
      sVar96 = auVar149._8_2_;
      sVar151 = -sVar96;
      sVar99 = auVar149._10_2_;
      sVar2 = -sVar99;
      sVar100 = auVar149._12_2_;
      sVar3 = -sVar100;
      sVar103 = auVar149._14_2_;
      sVar4 = -sVar103;
      auVar117._0_2_ = (ushort)(sVar141 < sVar71) * sVar71 | (ushort)(sVar141 >= sVar71) * sVar141;
      auVar117._2_2_ = (ushort)(sVar118 < sVar92) * sVar92 | (ushort)(sVar118 >= sVar92) * sVar118;
      auVar117._4_2_ = (ushort)(sVar122 < sVar93) * sVar93 | (ushort)(sVar122 >= sVar93) * sVar122;
      auVar117._6_2_ = (ushort)(sVar146 < sVar95) * sVar95 | (ushort)(sVar146 >= sVar95) * sVar146;
      auVar117._8_2_ = (ushort)(sVar151 < sVar96) * sVar96 | (ushort)(sVar151 >= sVar96) * sVar151;
      auVar117._10_2_ = (ushort)(sVar2 < sVar99) * sVar99 | (ushort)(sVar2 >= sVar99) * sVar2;
      auVar117._12_2_ = (ushort)(sVar3 < sVar100) * sVar100 | (ushort)(sVar3 >= sVar100) * sVar3;
      auVar117._14_2_ = (ushort)(sVar4 < sVar103) * sVar103 | (ushort)(sVar4 >= sVar103) * sVar4;
      auVar119 = psraw(auVar149,0xf);
      auVar170._0_12_ = auVar149._0_12_;
      auVar170._12_2_ = sVar95;
      auVar170._14_2_ = auVar119._6_2_;
      auVar169._12_4_ = auVar170._12_4_;
      auVar169._0_10_ = auVar149._0_10_;
      auVar169._10_2_ = auVar119._4_2_;
      auVar168._10_6_ = auVar169._10_6_;
      auVar168._0_8_ = auVar149._0_8_;
      auVar168._8_2_ = sVar93;
      auVar167._8_8_ = auVar168._8_8_;
      auVar167._6_2_ = auVar119._2_2_;
      auVar167._4_2_ = sVar92;
      auVar167._2_2_ = auVar119._0_2_;
      auVar167._0_2_ = sVar71;
      uVar197 = auVar119._10_2_;
      uVar199 = auVar119._12_2_;
      uVar201 = auVar119._14_2_;
      *(undefined1 (*) [16])(qcoeff_ptr + lVar61 + 8) = auVar167;
      ptVar1 = qcoeff_ptr + lVar61 + 0xc;
      *(short *)ptVar1 = sVar96;
      *(ushort *)((long)ptVar1 + 2) = auVar119._8_2_;
      *(short *)(ptVar1 + 1) = sVar99;
      *(ushort *)((long)ptVar1 + 6) = uVar197;
      *(short *)(ptVar1 + 2) = sVar100;
      *(ushort *)((long)ptVar1 + 10) = uVar199;
      *(short *)(ptVar1 + 3) = sVar103;
      *(ushort *)((long)ptVar1 + 0xe) = uVar201;
      auVar8._10_2_ = 0;
      auVar8._0_10_ = auVar65._0_10_;
      auVar8._12_2_ = auVar65._6_2_;
      auVar16._8_2_ = auVar65._4_2_;
      auVar16._0_8_ = auVar65._0_8_;
      auVar16._10_4_ = auVar8._10_4_;
      auVar51._6_8_ = 0;
      auVar51._0_6_ = auVar16._8_6_;
      auVar25._4_2_ = auVar65._2_2_;
      auVar25._0_4_ = auVar65._0_4_;
      auVar25._6_8_ = SUB148(auVar51 << 0x40,6);
      auVar171._0_4_ = auVar65._0_4_ & 0xffff;
      auVar171._4_10_ = auVar25._4_10_;
      auVar171._14_2_ = 0;
      auVar90._0_4_ = CONCAT22(0,auVar65._8_2_);
      auVar90._4_2_ = uVar187;
      auVar90._6_2_ = 0;
      auVar90._8_2_ = uVar189;
      auVar90._10_2_ = 0;
      auVar90._12_2_ = uVar195;
      auVar90._14_2_ = 0;
      sVar141 = auVar158._6_2_ * auVar127._6_2_;
      auVar65 = pmulhw(auVar158,auVar127);
      uVar59 = CONCAT22(auVar65._6_2_,sVar141);
      Var45 = CONCAT64(CONCAT42(uVar59,auVar65._4_2_),
                       CONCAT22(auVar158._4_2_ * auVar127._4_2_,sVar141));
      auVar52._4_8_ = (long)((unkuint10)Var45 >> 0x10);
      auVar52._2_2_ = auVar65._2_2_;
      auVar52._0_2_ = auVar158._2_2_ * auVar127._2_2_;
      uVar72 = CONCAT22(auVar65._8_2_,auVar158._8_2_ * auVar127._8_2_);
      auVar176._0_8_ = CONCAT26(auVar65._10_2_,CONCAT24(auVar158._10_2_ * auVar127._10_2_,uVar72));
      auVar176._8_2_ = auVar158._12_2_ * auVar127._12_2_;
      auVar176._10_2_ = auVar65._12_2_;
      auVar179._12_2_ = auVar158._14_2_ * auVar127._14_2_;
      auVar179._0_12_ = auVar176;
      auVar179._14_2_ = auVar65._14_2_;
      auVar194._0_4_ = CONCAT22(auVar65._0_2_,auVar158._0_2_ * auVar127._0_2_) >> 1;
      auVar194._4_4_ = auVar52._0_4_ >> 1;
      auVar194._8_4_ = (uint)((unkuint10)Var45 >> 0x10) >> 1;
      auVar194._12_4_ = uVar59 >> 1;
      auVar180._0_4_ = uVar72 >> 1;
      auVar180._4_4_ = (uint)((ulong)auVar176._0_8_ >> 0x21);
      auVar180._8_4_ = auVar176._8_4_ >> 1;
      auVar180._12_4_ = auVar179._12_4_ >> 1;
      auVar194 = auVar194 ^ auVar171;
      auVar180 = auVar180 ^ auVar90;
      piVar63 = dqcoeff_ptr + lVar61;
      *piVar63 = auVar194._0_4_ - auVar171._0_4_;
      piVar63[1] = auVar194._4_4_ - auVar25._4_4_;
      piVar63[2] = auVar194._8_4_ - auVar16._8_4_;
      piVar63[3] = auVar194._12_4_ - (auVar8._10_4_ >> 0x10);
      piVar63 = dqcoeff_ptr + lVar61 + 4;
      *piVar63 = auVar180._0_4_ - auVar90._0_4_;
      piVar63[1] = auVar180._4_4_ - (uint)uVar187;
      piVar63[2] = auVar180._8_4_ - (uint)uVar189;
      piVar63[3] = auVar180._12_4_ - (uint)uVar195;
      auVar9._10_2_ = 0;
      auVar9._0_10_ = auVar119._0_10_;
      auVar9._12_2_ = auVar119._6_2_;
      auVar17._8_2_ = auVar119._4_2_;
      auVar17._0_8_ = auVar119._0_8_;
      auVar17._10_4_ = auVar9._10_4_;
      auVar53._6_8_ = 0;
      auVar53._0_6_ = auVar17._8_6_;
      auVar26._4_2_ = auVar119._2_2_;
      auVar26._0_4_ = auVar119._0_4_;
      auVar26._6_8_ = SUB148(auVar53 << 0x40,6);
      auVar91._0_4_ = auVar119._0_4_ & 0xffff;
      auVar91._4_10_ = auVar26._4_10_;
      auVar91._14_2_ = 0;
      auVar150._0_4_ = CONCAT22(0,auVar119._8_2_);
      auVar150._4_2_ = uVar197;
      auVar150._6_2_ = 0;
      auVar150._8_2_ = uVar199;
      auVar150._10_2_ = 0;
      auVar150._12_2_ = uVar201;
      auVar150._14_2_ = 0;
      sVar141 = auVar117._6_2_ * auVar127._6_2_;
      auVar65 = pmulhw(auVar117,auVar127);
      uVar59 = CONCAT22(auVar65._6_2_,sVar141);
      Var45 = CONCAT64(CONCAT42(uVar59,auVar65._4_2_),
                       CONCAT22(auVar117._4_2_ * auVar127._4_2_,sVar141));
      auVar54._4_8_ = (long)((unkuint10)Var45 >> 0x10);
      auVar54._2_2_ = auVar65._2_2_;
      auVar54._0_2_ = auVar117._2_2_ * auVar127._2_2_;
      uVar72 = CONCAT22(auVar65._8_2_,auVar117._8_2_ * auVar127._8_2_);
      auVar153._0_8_ = CONCAT26(auVar65._10_2_,CONCAT24(auVar117._10_2_ * auVar127._10_2_,uVar72));
      auVar153._8_2_ = auVar117._12_2_ * auVar127._12_2_;
      auVar153._10_2_ = auVar65._12_2_;
      auVar159._12_2_ = auVar117._14_2_ * auVar127._14_2_;
      auVar159._0_12_ = auVar153;
      auVar159._14_2_ = auVar65._14_2_;
      auVar172._0_4_ = CONCAT22(auVar65._0_2_,auVar117._0_2_ * auVar127._0_2_) >> 1;
      auVar172._4_4_ = auVar54._0_4_ >> 1;
      auVar172._8_4_ = (uint)((unkuint10)Var45 >> 0x10) >> 1;
      auVar172._12_4_ = uVar59 >> 1;
      auVar160._0_4_ = uVar72 >> 1;
      auVar160._4_4_ = (uint)((ulong)auVar153._0_8_ >> 0x21);
      auVar160._8_4_ = auVar153._8_4_ >> 1;
      auVar160._12_4_ = auVar159._12_4_ >> 1;
      auVar172 = auVar172 ^ auVar91;
      auVar160 = auVar160 ^ auVar150;
      piVar63 = dqcoeff_ptr + lVar61 + 8;
      *piVar63 = auVar172._0_4_ - auVar91._0_4_;
      piVar63[1] = auVar172._4_4_ - auVar26._4_4_;
      piVar63[2] = auVar172._8_4_ - auVar17._8_4_;
      piVar63[3] = auVar172._12_4_ - (auVar9._10_4_ >> 0x10);
      piVar63 = dqcoeff_ptr + lVar61 + 0xc;
      *piVar63 = auVar160._0_4_ - auVar150._0_4_;
      piVar63[1] = auVar160._4_4_ - (uint)uVar197;
      piVar63[2] = auVar160._8_4_ - (uint)uVar199;
      piVar63[3] = auVar160._12_4_ - (uint)uVar201;
      lVar61 = (long)iVar73;
      bVar57 = true;
      bVar18 = true;
    } while (lVar61 < n_coeffs);
  }
LAB_00924212:
  if (bVar56) {
    uVar142 = ((short)uVar142 < (short)uVar132) * uVar132 |
              ((short)uVar142 >= (short)uVar132) * uVar142;
    uVar143 = ((short)uVar143 < (short)uVar138) * uVar138 |
              ((short)uVar143 >= (short)uVar138) * uVar143;
    uVar144 = ((short)uVar144 < (short)uVar139) * uVar139 |
              ((short)uVar144 >= (short)uVar139) * uVar144;
    uVar140 = ((short)uVar145 < (short)uVar140) * uVar140 |
              ((short)uVar145 >= (short)uVar140) * uVar145;
    uVar145 = ((short)uVar144 < (short)uVar142) * uVar142 |
              ((short)uVar144 >= (short)uVar142) * uVar144;
    uVar144 = ((short)uVar140 < (short)uVar143) * uVar143 |
              ((short)uVar140 >= (short)uVar143) * uVar140;
    uVar59 = (ushort)(((short)uVar144 < (short)uVar145) * uVar145 |
                     ((short)uVar144 >= (short)uVar145) * uVar144) + 1;
  }
  else {
    uVar59 = 0;
  }
  if (bVar57) {
    uVar145 = ((short)uVar181 < (short)uVar129) * uVar129 |
              ((short)uVar181 >= (short)uVar129) * uVar181;
    uVar144 = ((short)uVar173 < (short)uVar128) * uVar128 |
              ((short)uVar173 >= (short)uVar128) * uVar173;
    uVar143 = ((short)uVar131 < (short)uVar185) * uVar185 |
              ((short)uVar131 >= (short)uVar185) * uVar131;
    uVar142 = ((short)uVar130 < (short)uVar183) * uVar183 |
              ((short)uVar130 >= (short)uVar183) * uVar130;
    uVar145 = ((short)uVar143 < (short)uVar145) * uVar145 |
              ((short)uVar143 >= (short)uVar145) * uVar143;
    uVar144 = ((short)uVar142 < (short)uVar144) * uVar144 |
              ((short)uVar142 >= (short)uVar144) * uVar142;
    uVar72 = (uint)(ushort)(((short)uVar144 < (short)uVar145) * uVar145 |
                           ((short)uVar144 >= (short)uVar145) * uVar144);
  }
  else {
    uVar72 = 0xffffffff;
  }
  if ((int)uVar59 <= (int)uVar72) {
    iVar73 = uVar72 + 1;
    psVar60 = scan + uVar72;
    do {
      sVar141 = *psVar60;
      qcoeff_ptr[sVar141] = 0;
      dqcoeff_ptr[sVar141] = 0;
      iVar73 = iVar73 + -1;
      psVar60 = psVar60 + -1;
    } while ((int)uVar59 < iVar73);
  }
  iVar73 = uVar59 + 1;
  uVar58 = (ulong)uVar59;
  do {
    if ((long)uVar58 < 1) {
      uVar145 = 0;
      break;
    }
    lVar61 = uVar58 - 1;
    uVar58 = uVar58 - 1;
    iVar73 = iVar73 + -1;
    uVar145 = (ushort)iVar73;
  } while (qcoeff_ptr[scan[lVar61]] == 0);
  *eob_ptr = uVar145;
  uVar72 = 0xffffffff;
  if (uVar59 != 0) {
    uVar58 = 0;
    do {
      if (qcoeff_ptr[scan[uVar58]] != 0) {
        uVar72 = (uint)uVar58;
        break;
      }
      uVar58 = uVar58 + 1;
    } while (uVar59 != uVar58);
  }
  if ((uVar145 != 0) && (uVar72 == uVar145 - 1)) {
    sVar141 = scan[uVar72];
    if (((qcoeff_ptr[sVar141] == 1) || (qcoeff_ptr[sVar141] == -1)) &&
       (uVar59 = coeff_ptr[sVar141] >> 0x1f,
       (int)((coeff_ptr[sVar141] << 5 ^ uVar59) - uVar59) <
       *(int *)(local_68 + (ulong)(sVar141 != 0) * 4 + -8) * 0x20 +
       (dequant_ptr[sVar141 != 0] * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar141] = 0;
      dqcoeff_ptr[sVar141] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_quantize_b_32x32_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  const int log_scale = 1;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i log_scale_vec = _mm_set1_epi16(log_scale);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  // Shift with rounding.
  zbin = _mm_add_epi16(zbin, log_scale_vec);
  round = _mm_add_epi16(round, log_scale_vec);
  zbin = _mm_srli_epi16(zbin, log_scale);
  round = _mm_srli_epi16(round, log_scale);
  zbin = _mm_sub_epi16(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  coeff0_sign = _mm_srai_epi16(coeff0, 15);
  coeff1_sign = _mm_srai_epi16(coeff1, 15);
  qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

  update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  update_mask1(&cmp_mask0, &cmp_mask1, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 12), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 12), zero);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr);
    store_coefficients(qcoeff1, qcoeff_ptr + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero, dqcoeff_ptr,
                                          &log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + 8, &log_scale);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    coeff0_sign = _mm_srai_epi16(coeff0, 15);
    coeff1_sign = _mm_srai_epi16(coeff1, 15);
    qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

    update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index, &is_found0,
                 &mask0);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    update_mask1(&cmp_mask0, &cmp_mask1, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 12), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 12), zero);
      index += 16;
      continue;
    }
    calculate_qcoeff_log_scale(&qcoeff0, round, quant, &shift, &log_scale);
    calculate_qcoeff_log_scale(&qcoeff1, round, quant, &shift, &log_scale);

    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    calculate_dqcoeff_and_store_log_scale(qcoeff0, dequant, zero,
                                          dqcoeff_ptr + index, &log_scale);
    calculate_dqcoeff_and_store_log_scale(qcoeff1, dequant, zero,
                                          dqcoeff_ptr + index + 8, &log_scale);
    index += 16;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}